

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlGlyphClassDefn.cpp
# Opt level: O0

bool __thiscall GdlGlyphClassDefn::IncludesGlyph(GdlGlyphClassDefn *this,utf16 w)

{
  uint uVar1;
  size_type_conflict sVar2;
  reference ppGVar3;
  undefined8 extraout_RDX;
  ushort in_SI;
  long in_RDI;
  size_t iglfd;
  ulong local_20;
  
  local_20 = 0;
  while( true ) {
    sVar2 = std::vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>::size
                      ((vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_> *)
                       (in_RDI + 0x58));
    if (sVar2 <= local_20) {
      return false;
    }
    ppGVar3 = std::vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>::operator[]
                        ((vector<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_> *)
                         (in_RDI + 0x58),local_20);
    uVar1 = (*((*ppGVar3)->super_GdlDefn)._vptr_GdlDefn[0xd])
                      (*ppGVar3,(ulong)in_SI,extraout_RDX,CONCAT62((int6)(sVar2 >> 0x10),in_SI));
    if ((uVar1 & 1) != 0) break;
    local_20 = local_20 + 1;
  }
  return true;
}

Assistant:

bool GdlGlyphClassDefn::IncludesGlyph(utf16 w)
{
	for (size_t iglfd = 0; iglfd < m_vpglfdMembers.size(); iglfd++)
	{
		if (m_vpglfdMembers[iglfd]->IncludesGlyph(w))
			return true;
	}
	return false;
}